

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O2

void __thiscall
solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
::~StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
          (StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this)

{
  StockPileColliderTests::~StockPileColliderTests((StockPileColliderTests *)this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_P(StockPileColliderGetUncoveredCardsPositionTests, getUncoveredCardsPosition) {
    const auto& uncoveredCardsPositionData = GetParam();
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(uncoveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getUncoveredCardsPosition(),
        uncoveredCardsPositionData.position
    );
}